

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.cpp
# Opt level: O0

QBitArray * __thiscall QBitArray::operator&=(QBitArray *this,QBitArray *other)

{
  QBitArray *pQVar1;
  undefined8 in_RSI;
  undefined8 in_RDI;
  
  pQVar1 = performBitwiseOperation<std::bit_and<unsigned_char>>(in_RDI,in_RSI);
  return pQVar1;
}

Assistant:

QBitArray &QBitArray::operator&=(QBitArray &&other)
{
    return performBitwiseOperation(*this, other, std::bit_and<uchar>());
}